

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertpng.c
# Opt level: O1

opj_image_t * pngtoimage(char *read_idf,opj_cparameters_t *params)

{
  OPJ_BYTE *__ptr;
  OPJ_BYTE **__ptr_00;
  FILE *__stream;
  size_t sVar1;
  opj_image_t *poVar2;
  ulong uVar3;
  ulong uVar4;
  png_uint_32 height;
  png_structp png;
  OPJ_INT32 *row32s;
  OPJ_BYTE **rows;
  png_infop info;
  OPJ_BYTE sigbuf [8];
  png_uint_32 local_54;
  png_structp local_50;
  OPJ_INT32 *local_48;
  OPJ_BYTE **local_40;
  png_infop local_38;
  long local_30;
  
  local_50 = (png_structp)0x0;
  local_38 = (png_infop)0x0;
  local_54 = 0;
  local_40 = (OPJ_BYTE **)0x0;
  local_48 = (OPJ_INT32 *)0x0;
  __stream = fopen(read_idf,"rb");
  if (__stream == (FILE *)0x0) {
    poVar2 = (opj_image_t *)0x0;
    fprintf(_stderr,"pngtoimage: can not open %s\n",read_idf);
  }
  else {
    sVar1 = fread(&local_30,1,8,__stream);
    if ((sVar1 == 8) && (local_30 == 0xa1a0a0d474e5089)) {
      poVar2 = (opj_image_t *)0x0;
      local_50 = (png_structp)png_create_read_struct("1.6.37",0,0,0);
      if (local_50 != (png_structp)0x0) {
        local_38 = (png_infop)png_create_info_struct(local_50);
        if (local_38 == (png_infop)0x0) {
          poVar2 = (opj_image_t *)0x0;
        }
        else {
          poVar2 = pngtoimage_internal(params,(FILE *)__stream,local_50,local_38,&local_54,&local_40
                                       ,&local_48);
        }
      }
    }
    else {
      poVar2 = (opj_image_t *)0x0;
      fprintf(_stderr,"pngtoimage: %s is no valid PNG file\n",read_idf);
    }
    __ptr_00 = local_40;
    if (local_40 != (OPJ_BYTE **)0x0) {
      uVar3 = (ulong)local_54;
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          __ptr = __ptr_00[uVar4];
          if (__ptr != (OPJ_BYTE *)0x0) {
            free(__ptr);
          }
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      free(__ptr_00);
    }
    if (local_48 != (OPJ_INT32 *)0x0) {
      free(local_48);
    }
    if (local_50 != (png_structp)0x0) {
      png_destroy_read_struct(&local_50,&local_38,0);
    }
    fclose(__stream);
  }
  return poVar2;
}

Assistant:

opj_image_t *pngtoimage(const char *read_idf, opj_cparameters_t * params)
{
    png_structp  png = NULL;
    png_infop    info = NULL;
    OPJ_UINT32 i;
    png_uint_32  height = 0U;
    FILE *reader = NULL;
    OPJ_BYTE** rows = NULL;
    OPJ_INT32* row32s = NULL;
    OPJ_BYTE sigbuf[8];
    opj_image_t *image = NULL;

    if ((reader = fopen(read_idf, "rb")) == NULL) {
        fprintf(stderr, "pngtoimage: can not open %s\n", read_idf);
        return NULL;
    }

    if (fread(sigbuf, 1, MAGIC_SIZE, reader) != MAGIC_SIZE
            || memcmp(sigbuf, PNG_MAGIC, MAGIC_SIZE) != 0) {
        fprintf(stderr, "pngtoimage: %s is no valid PNG file\n", read_idf);
        goto fin;
    }

    if ((png = png_create_read_struct(PNG_LIBPNG_VER_STRING,
                                      NULL, NULL, NULL)) == NULL) {
        goto fin;
    }
    if ((info = png_create_info_struct(png)) == NULL) {
        goto fin;
    }

    image = pngtoimage_internal(params, reader, png, info, &height, &rows, &row32s);
fin:
    if (rows) {
        for (i = 0; i < height; ++i)
            if (rows[i]) {
                free(rows[i]);
            }
        free(rows);
    }
    if (row32s) {
        free(row32s);
    }
    if (png) {
        png_destroy_read_struct(&png, &info, NULL);
    }

    fclose(reader);

    return image;

}